

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  float fVar1;
  ImGuiContext *pIVar2;
  value_type_conflict2 *pvVar3;
  ImVec4 *lhs;
  bool bVar4;
  ImVec4 local_78;
  ImVec4 local_68;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 tooltip_pos;
  ImGuiPayload *payload;
  ImGuiID IStack_2c;
  bool is_hovered;
  int mouse_button;
  ImGuiID source_parent_id;
  ImGuiID source_id;
  bool source_drag_active;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDragDropFlags flags_local;
  
  pIVar2 = GImGui;
  _source_id = GImGui->CurrentWindow;
  IStack_2c = 0;
  if ((flags & 0x10U) == 0) {
    mouse_button = (_source_id->DC).LastItemId;
    if ((mouse_button != 0) && (GImGui->ActiveId != mouse_button)) {
      return false;
    }
    if (((GImGui->IO).MouseDown[0] & 1U) == 0) {
      return false;
    }
    if (mouse_button == 0) {
      if ((flags & 8U) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x3361,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      bVar4 = ((_source_id->DC).LastItemStatusFlags & 1U) != 0;
      if ((!bVar4) && ((GImGui->ActiveId == 0 || (GImGui->ActiveIdWindow != _source_id)))) {
        return false;
      }
      mouse_button = ImGuiWindow::GetIDFromRectangle(_source_id,&(_source_id->DC).LastItemRect);
      (_source_id->DC).LastItemId = mouse_button;
      if ((bVar4) && (SetHoveredID(mouse_button), ((pIVar2->IO).MouseClicked[0] & 1U) != 0)) {
        SetActiveID(mouse_button,_source_id);
        FocusWindow(_source_id);
      }
      if (pIVar2->ActiveId == mouse_button) {
        pIVar2->ActiveIdAllowOverlap = bVar4;
      }
    }
    if (pIVar2->ActiveId != mouse_button) {
      return false;
    }
    pvVar3 = ImVector<unsigned_int>::back(&_source_id->IDStack);
    IStack_2c = *pvVar3;
    source_parent_id._3_1_ = IsMouseDragging(0,-1.0);
  }
  else {
    _source_id = (ImGuiWindow *)0x0;
    mouse_button = ImHash("#SourceExtern",0,0);
    source_parent_id._3_1_ = true;
  }
  if (source_parent_id._3_1_ == false) {
    g._7_1_ = false;
  }
  else {
    if ((pIVar2->DragDropActive & 1U) == 0) {
      if (mouse_button == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x3387,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      ClearDragDrop();
      tooltip_pos = (ImVec2)&pIVar2->DragDropPayload;
      (pIVar2->DragDropPayload).SourceId = mouse_button;
      (pIVar2->DragDropPayload).SourceParentId = IStack_2c;
      pIVar2->DragDropActive = true;
      pIVar2->DragDropSourceFlags = flags;
      pIVar2->DragDropMouseButton = 0;
    }
    if ((flags & 1U) == 0) {
      fVar1 = (pIVar2->Style).MouseCursorScale;
      ImVec2::ImVec2(&local_50,fVar1 * 16.0,fVar1 * 8.0);
      local_48 = operator+(&(pIVar2->IO).MousePos,&local_50);
      ImVec2::ImVec2(&local_58,0.0,0.0);
      SetNextWindowPos(&local_48,0,&local_58);
      lhs = GetStyleColorVec4(4);
      ImVec4::ImVec4(&local_78,1.0,1.0,1.0,0.6);
      local_68 = operator*(lhs,&local_78);
      PushStyleColor(4,&local_68);
      BeginTooltip();
    }
    if (((flags & 2U) == 0) && ((flags & 0x10U) == 0)) {
      (_source_id->DC).LastItemStatusFlags = (_source_id->DC).LastItemStatusFlags & 0xfffffffe;
    }
    g._7_1_ = true;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    int mouse_button = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            bool is_hovered = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) != 0;
            if (!is_hovered && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            if (is_hovered)
                SetHoveredID(source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);
    }
    else
    {
        window = NULL;
        source_id = ImHash("#SourceExtern", 0);
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // FIXME-DRAG
            //SetNextWindowPos(g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding);
            //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This is better but e.g ColorButton with checkboard has issue with transparent colors :(

            // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
            // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
            ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
            SetNextWindowPos(tooltip_pos);
            PushStyleColor(ImGuiCol_PopupBg, GetStyleColorVec4(ImGuiCol_PopupBg) * ImVec4(1.0f, 1.0f, 1.0f, 0.6f));
            BeginTooltip();
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}